

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O1

void helper_mtc0_hwrena_mips64el(CPUMIPSState_conflict5 *env,target_ulong arg1)

{
  uint uVar1;
  
  uVar1 = 0xf;
  if ((env->CP0_Config1 & 0x10) != 0) {
    uVar1 = (uint)((*(byte *)((long)&env->insn_flags + 1) & 0x20) >> 5) << 4 | 0xf;
  }
  uVar1 = (uint)env->insn_flags >> 8 & 0x20 | uVar1;
  if ((env->CP0_Config3 & 0x2000) != 0) {
    uVar1 = uVar1 | 0x20000000;
    env->hflags = (uint)(arg1 >> 8) & 0x200000 | env->hflags & 0xffdfffff;
  }
  env->CP0_HWREna = (uint)arg1 & uVar1;
  return;
}

Assistant:

void helper_mtc0_hwrena(CPUMIPSState *env, target_ulong arg1)
{
    uint32_t mask = 0x0000000F;

    if ((env->CP0_Config1 & (1 << CP0C1_PC)) &&
        (env->insn_flags & ISA_MIPS32R6)) {
        mask |= (1 << 4);
    }
    if (env->insn_flags & ISA_MIPS32R6) {
        mask |= (1 << 5);
    }
    if (env->CP0_Config3 & (1 << CP0C3_ULRI)) {
        mask |= (1 << 29);

        if (arg1 & (1 << 29)) {
            env->hflags |= MIPS_HFLAG_HWRENA_ULR;
        } else {
            env->hflags &= ~MIPS_HFLAG_HWRENA_ULR;
        }
    }

    env->CP0_HWREna = arg1 & mask;
}